

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O0

void HTS_Label_load(HTS_Label *label,size_t sampling_rate,size_t fperiod,HTS_File *fp)

{
  HTS_Boolean HVar1;
  ushort **ppuVar2;
  _HTS_LabelString *p_Var3;
  char *pcVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  HTS_Label *in_RDI;
  char *str;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double rate;
  double end;
  double start;
  HTS_LabelString *lstring;
  char buff [1024];
  char *in_stack_fffffffffffffbc0;
  double in_stack_fffffffffffffbc8;
  _HTS_LabelString *buff_00;
  char in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbd9;
  
  buff_00 = (HTS_LabelString *)0x0;
  auVar5._8_4_ = (int)((ulong)in_RSI >> 0x20);
  auVar5._0_8_ = in_RSI;
  auVar5._12_4_ = 0x45300000;
  auVar6._8_4_ = (int)((ulong)in_RDX >> 0x20);
  auVar6._0_8_ = in_RDX;
  auVar6._12_4_ = 0x45300000;
  str = (char *)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)in_RSI) - 4503599627370496.0)) /
                (((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0)) * 10000000.0));
  if ((in_RDI->head == (HTS_LabelString *)0x0) && (in_RDI->size == 0)) {
    while ((HVar1 = HTS_get_token_from_fp
                              ((HTS_File *)
                               CONCAT71(in_stack_fffffffffffffbd9,in_stack_fffffffffffffbd8),
                               (char *)buff_00), HVar1 != '\0' &&
           (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)in_stack_fffffffffffffbd8] & 0x8000) != 0)))
    {
      in_RDI->size = in_RDI->size + 1;
      if (buff_00 == (HTS_LabelString *)0x0) {
        buff_00 = (_HTS_LabelString *)
                  HTS_calloc((size_t)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
        in_RDI->head = buff_00;
      }
      else {
        p_Var3 = (_HTS_LabelString *)
                 HTS_calloc((size_t)in_stack_fffffffffffffbc8,(size_t)in_stack_fffffffffffffbc0);
        buff_00->next = p_Var3;
        buff_00 = buff_00->next;
      }
      HVar1 = isdigit_string(str);
      if (HVar1 == '\0') {
        buff_00->start = -1.0;
        buff_00->end = -1.0;
      }
      else {
        in_stack_fffffffffffffbc8 = atof(&stack0xfffffffffffffbd8);
        HTS_get_token_from_fp
                  ((HTS_File *)CONCAT71(in_stack_fffffffffffffbd9,in_stack_fffffffffffffbd8),
                   (char *)buff_00);
        in_stack_fffffffffffffbc0 = (char *)atof(&stack0xfffffffffffffbd8);
        HTS_get_token_from_fp
                  ((HTS_File *)CONCAT71(in_stack_fffffffffffffbd9,in_stack_fffffffffffffbd8),
                   (char *)buff_00);
        buff_00->start = (double)str * in_stack_fffffffffffffbc8;
        buff_00->end = (double)str * (double)in_stack_fffffffffffffbc0;
      }
      buff_00->next = (_HTS_LabelString *)0x0;
      pcVar4 = HTS_strdup(in_stack_fffffffffffffbc0);
      buff_00->name = pcVar4;
    }
    HTS_Label_check_time(in_RDI);
  }
  else {
    HTS_error(1,"HTS_Label_load_from_fp: label is not initialized.\n");
  }
  return;
}

Assistant:

static void HTS_Label_load(HTS_Label * label, size_t sampling_rate, size_t fperiod, HTS_File * fp)
{
   char buff[HTS_MAXBUFLEN];
   HTS_LabelString *lstring = NULL;
   double start, end;
   const double rate = (double) sampling_rate / ((double) fperiod * 1e+7);

   if (label->head || label->size != 0) {
      HTS_error(1, "HTS_Label_load_from_fp: label is not initialized.\n");
      return;
   }

   /* parse label file */
   while (HTS_get_token_from_fp(fp, buff)) {
      if (!isgraph((int) buff[0]))
         break;
      label->size++;

      if (lstring) {
         lstring->next = (HTS_LabelString *) HTS_calloc(1, sizeof(HTS_LabelString));
         lstring = lstring->next;
      } else {                  /* first time */
         lstring = (HTS_LabelString *) HTS_calloc(1, sizeof(HTS_LabelString));
         label->head = lstring;
      }
      if (isdigit_string(buff)) {       /* has frame infomation */
         start = atof(buff);
         HTS_get_token_from_fp(fp, buff);
         end = atof(buff);
         HTS_get_token_from_fp(fp, buff);
         lstring->start = rate * start;
         lstring->end = rate * end;
      } else {
         lstring->start = -1.0;
         lstring->end = -1.0;
      }
      lstring->next = NULL;
      lstring->name = HTS_strdup(buff);
   }
   HTS_Label_check_time(label);
}